

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDynamicLoader.cxx
# Opt level: O3

int TestDynamicLoader(char *libname,char *symbol,int r1,int r2,int r3,int flags)

{
  int iVar1;
  size_t sVar2;
  LibraryHandle lib;
  SymbolPointer p_Var3;
  long lVar4;
  char *pcVar5;
  allocator<char> local_55;
  int local_54;
  string local_50;
  
  local_54 = r3;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Testing: ",9);
  if (libname == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x140728);
  }
  else {
    sVar2 = strlen(libname);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,libname,sVar2);
  }
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '(');
  std::ostream::put('(');
  std::ostream::flush();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,libname,&local_55);
  lib = cmsys::DynamicLoader::OpenLibrary(&local_50,0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((r1 == 0) == (lib == (LibraryHandle)0x0)) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,symbol,&local_55);
    p_Var3 = cmsys::DynamicLoader::GetSymbolAddress(lib,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if ((r2 == 0) == (p_Var3 == (SymbolPointer)0x0)) {
      iVar1 = cmsys::DynamicLoader::CloseLibrary(lib);
      if ((local_54 == 0) == (iVar1 == 0)) {
        return 0;
      }
      pcVar5 = "CloseLibrary: ";
      lVar4 = 0xe;
    }
    else {
      pcVar5 = "GetSymbolAddress: ";
      lVar4 = 0x12;
    }
  }
  else {
    pcVar5 = "OpenLibrary: ";
    lVar4 = 0xd;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar5,lVar4);
  pcVar5 = cmsys::DynamicLoader::LastError();
  if (pcVar5 == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x140728);
  }
  else {
    sVar2 = strlen(pcVar5);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar5,sVar2);
  }
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '(');
  std::ostream::put('(');
  std::ostream::flush();
  return 1;
}

Assistant:

static int TestDynamicLoader(const char* libname, const char* symbol, int r1,
                             int r2, int r3, int flags = 0)
{
  std::cerr << "Testing: " << libname << std::endl;
  kwsys::DynamicLoader::LibraryHandle l =
    kwsys::DynamicLoader::OpenLibrary(libname, flags);
  // If result is incompatible with expectation just fails (xor):
  if ((r1 && !l) || (!r1 && l)) {
    std::cerr << "OpenLibrary: " << kwsys::DynamicLoader::LastError()
              << std::endl;
    return 1;
  }
  kwsys::DynamicLoader::SymbolPointer f =
    kwsys::DynamicLoader::GetSymbolAddress(l, symbol);
  if ((r2 && !f) || (!r2 && f)) {
    std::cerr << "GetSymbolAddress: " << kwsys::DynamicLoader::LastError()
              << std::endl;
    return 1;
  }
#ifndef __APPLE__
  int s = kwsys::DynamicLoader::CloseLibrary(l);
  if ((r3 && !s) || (!r3 && s)) {
    std::cerr << "CloseLibrary: " << kwsys::DynamicLoader::LastError()
              << std::endl;
    return 1;
  }
#else
  (void)r3;
#endif
  return 0;
}